

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O2

errr borg_what_text(wchar_t x,wchar_t y,wchar_t n,uint8_t *a,char *s)

{
  int iVar1;
  int *piVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  ulong uVar5;
  wchar_t wVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  wchar_t wVar10;
  wchar_t h;
  wchar_t w;
  wchar_t screen_str [1024];
  
  wVar10 = -n;
  if (L'\0' < n) {
    wVar10 = n;
  }
  Term_get_size(&w,&h);
  wVar6 = w - x;
  if (wVar10 + x <= w) {
    wVar6 = wVar10;
  }
  piVar2 = Term->scr->a[y];
  pwVar3 = Term->scr->c[y];
  uVar4 = 0;
  uVar5 = (ulong)(uint)wVar6;
  if (wVar6 < L'\x01') {
    uVar5 = uVar4;
  }
  iVar7 = 0;
  do {
    uVar9 = uVar5;
    if (uVar5 == uVar4) {
LAB_002153f1:
      screen_str[uVar5] = L'\0';
      *a = (uint8_t)iVar7;
      wcstombs(s,screen_str,(ulong)(uint)(wVar10 + L'\x01'));
      return (errr)((wchar_t)uVar9 != n && L'\0' < n);
    }
    wVar6 = pwVar3[(long)x + uVar4];
    if ((wVar6 == L' ') || (iVar1 = piVar2[(long)x + uVar4], iVar1 == 0)) {
      wVar6 = L' ';
      iVar8 = iVar7;
    }
    else {
      iVar8 = iVar1;
      if ((iVar7 != 0) && (iVar8 = iVar7, iVar1 != iVar7)) {
        uVar5 = uVar4;
        uVar9 = uVar4 & 0xffffffff;
        goto LAB_002153f1;
      }
    }
    screen_str[uVar4] = wVar6;
    uVar4 = uVar4 + 1;
    iVar7 = iVar8;
  } while( true );
}

Assistant:

errr borg_what_text(int x, int y, int n, uint8_t *a, char *s)
{
    int     i;
    wchar_t screen_str[1024];

    int     t_a;
    wchar_t t_c;

    int     *aa;
    wchar_t *cc;

    int w, h;

    /* Current attribute */
    int d_a = 0;

    /* Max length to scan for */
    int m = ABS(n);

    /* Activate */
    /* Do I need to get the right window? Term_activate(angband_term[0]); */

    /* Obtain the size */
    (void)Term_get_size(&w, &h);

    /* Hack -- Do not run off the screen */
    if (x + m > w)
        m = w - x;

    /* Direct access XXX XXX XXX */
    aa = &(Term->scr->a[y][x]);
    cc = &(Term->scr->c[y][x]);

    /* Grab the string */
    for (i = 0; i < m; i++) {
        /* Access */
        t_a = *aa++;
        t_c = *cc++;

        /* Handle spaces */
        if ((t_c == L' ') || !t_a) {
            /* Save space */
            screen_str[i] = L' ';
        }

        /* Handle real text */
        else {
            /* Attribute ready */
            if (d_a) {
                /* Verify the "attribute" (or stop) */
                if (t_a != d_a)
                    break;
            }

            /* Acquire attribute */
            else {
                /* Save it */
                d_a = t_a;
            }

            /* Save char */
            screen_str[i] = t_c;
        }
    }

    /* Terminate the string */
    screen_str[i] = L'\0';

    /* Save the attribute */
    (*a) = d_a;

    /* Convert back to a char string */
    wcstombs(s, screen_str, ABS(n) + 1);
    /* Too short */
    if ((n > 0) && (i != n))
        return 1;

    /* Success */
    return 0;
}